

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O2

void __thiscall diff_match_patch_test::testDiffCommonSuffix(diff_match_patch_test *this)

{
  int iVar1;
  diff_match_patch_test *pdVar2;
  allocator<wchar_t> local_6b;
  allocator<wchar_t> local_6a;
  allocator<wchar_t> local_69;
  wstring local_68 [32];
  wstring local_48 [32];
  wstring local_28;
  
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"diff_commonSuffix: Null case.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"abc",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"xyz",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::diff_commonSuffix((wstring *)this,local_48);
  assertEquals(pdVar2,&local_28,0,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"diff_commonSuffix: Non-null case.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"abcdef1234",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"xyz1234",&local_6b);
  pdVar2 = this;
  iVar1 = diff_match_patch::diff_commonSuffix((wstring *)this,local_48);
  assertEquals(pdVar2,&local_28,4,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_28,L"diff_commonSuffix: Whole case.",&local_69);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,L"1234",&local_6a);
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,L"xyz1234",&local_6b);
  iVar1 = diff_match_patch::diff_commonSuffix((wstring *)this,local_48);
  assertEquals(this,&local_28,4,iVar1);
  std::__cxx11::wstring::~wstring(local_68);
  std::__cxx11::wstring::~wstring(local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_28);
  return;
}

Assistant:

void diff_match_patch_test::testDiffCommonSuffix() {
  // Detect any common suffix.
  assertEquals(L"diff_commonSuffix: Null case.", 0, dmp.diff_commonSuffix(L"abc", L"xyz"));

  assertEquals(L"diff_commonSuffix: Non-null case.", 4, dmp.diff_commonSuffix(L"abcdef1234", L"xyz1234"));

  assertEquals(L"diff_commonSuffix: Whole case.", 4, dmp.diff_commonSuffix(L"1234", L"xyz1234"));
}